

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::internal::printf_width_handler<wchar_t>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
               (printf_width_handler<wchar_t> *vis,
               basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
               *arg)

{
  undefined4 uVar1;
  basic_string_view<wchar_t> bVar2;
  handle hVar3;
  custom_value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  *in_RSI;
  printf_width_handler<wchar_t> *in_RDI;
  wchar_t *in_stack_ffffffffffffff98;
  printf_width_handler<wchar_t> *in_stack_ffffffffffffffa0;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  printf_width_handler<wchar_t> *in_stack_ffffffffffffffb0;
  unsigned_long_long in_stack_ffffffffffffffb8;
  printf_width_handler<wchar_t> *in_stack_ffffffffffffffc0;
  handle local_38;
  basic_string_view<wchar_t> local_28 [2];
  type local_4;
  
  uVar1 = *(undefined4 *)&in_RSI[1].value;
  uVar4 = (undefined2)uVar1;
  uVar5 = (undefined2)((uint)uVar1 >> 0x10);
  uVar6 = 0;
  switch(uVar1) {
  case 0:
  default:
switchD_00160da8_default:
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_RDI);
    break;
  case 1:
    goto switchD_00160da8_default;
  case 2:
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_stack_ffffffffffffffb0,0);
    break;
  case 3:
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_stack_ffffffffffffffb0,0);
    break;
  case 4:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 5:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 6:
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_stack_ffffffffffffffb0,false);
    break;
  case 7:
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_stack_ffffffffffffffb0,L'\0');
    break;
  case 8:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
    break;
  case 9:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffb0,
                         (longdouble)CONCAT28(uVar4,in_stack_ffffffffffffffa0));
    break;
  case 10:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 0xb:
    basic_string_view<wchar_t>::basic_string_view
              (local_28,(wchar_t *)in_RSI->value,(size_t)in_RSI->format);
    bVar2.data_._2_2_ = uVar5;
    bVar2.data_._0_2_ = uVar4;
    bVar2.data_._4_4_ = uVar6;
    bVar2.size_ = (size_t)in_stack_ffffffffffffffb0;
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_RDI,bVar2);
    break;
  case 0xc:
    local_4 = internal::printf_width_handler<wchar_t>::operator()
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 0xd:
    basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
    ::handle::handle(&local_38,*in_RSI);
    hVar3.custom_.value._2_2_ = uVar5;
    hVar3.custom_.value._0_2_ = uVar4;
    hVar3.custom_.value._4_4_ = uVar6;
    hVar3.custom_.format =
         (_func_void_void_ptr_basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_ptr
          *)in_stack_ffffffffffffffb0;
    local_4 = internal::printf_width_handler<wchar_t>::operator()(in_stack_ffffffffffffffa0,hVar3);
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}